

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellReissner.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChDampingReissner::ComputeDampingMatrix
          (ChDampingReissner *this,ChMatrixRef *R,ChVector<double> *deps_u,ChVector<double> *deps_v,
          ChVector<double> *dkur_u,ChVector<double> *dkur_v,double z_inf,double z_sup,double angle)

{
  Scalar *pSVar1;
  long row;
  ChVector<double> mv;
  ChVector<double> mu;
  ChVectorN<double,_12> stress_1;
  ChVector<double> nv;
  ChVector<double> nu;
  ChVector<double> ddkur_v;
  ChVector<double> ddkur_u;
  ChVector<double> ddeps_v;
  ChVector<double> ddeps_u;
  ChVectorN<double,_12> stress_0;
  ChVectorN<double,_12> stress_d;
  ChVectorN<double,_12> dstrain_0;
  double local_318 [5];
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *local_2d8;
  Matrix<double,_12,_1,_0,_12,_1> *local_2d0;
  VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> local_2c0;
  double *local_258 [7];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  ChVector<double> local_1e0;
  ChVector<double> local_1c8;
  ChVector<double> local_1b0;
  ChVector<double> local_198;
  Matrix<double,_12,_1,_0,_12,_1> local_180;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> local_120 [6];
  Matrix<double,_12,_1,_0,_12,_1> local_c0;
  
  if ((R->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value != 0xc) {
    __assert_fail("R.rows() == 12",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMaterialShellReissner.cpp"
                  ,0x248,
                  "virtual void chrono::fea::ChDampingReissner::ComputeDampingMatrix(ChMatrixRef, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const double, const double, const double)"
                 );
  }
  if ((R->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value == 0xc) {
    Eigen::
    DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>::
    setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             *)R);
    local_2c0.super_Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>.
    super_BlockImpl<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>,_0>.m_data =
         deps_u->m_data;
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)&local_180,&local_c0,0,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)&local_180,
               (Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
               &local_2c0);
    local_2c0.super_Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>.
    super_BlockImpl<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>,_0>.m_data =
         deps_v->m_data;
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)&local_180,&local_c0,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)&local_180,
               (Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
               &local_2c0);
    local_2c0.super_Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>.
    super_BlockImpl<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>,_0>.m_data =
         dkur_u->m_data;
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)&local_180,&local_c0,6,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)&local_180,
               (Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
               &local_2c0);
    local_2c0.super_Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>.
    super_BlockImpl<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>,_0>.m_data =
         dkur_v->m_data;
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)&local_180,&local_c0,9,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
              ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)&local_180,
               (Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
               &local_2c0);
    local_200 = 0;
    uStack_1f8 = 0;
    local_1f0 = 0;
    local_220 = 0;
    uStack_218 = 0;
    local_210 = 0;
    local_2f0 = 0;
    uStack_2e8 = 0;
    local_2e0 = 0;
    local_318[1] = 0.0;
    local_318[2] = 0.0;
    local_318[3] = 0.0;
    (*this->_vptr_ChDampingReissner[2])
              (z_inf,z_sup,angle,this,&local_200,&local_220,&local_2f0,local_318 + 1,deps_u,deps_v,
               dkur_u,dkur_v);
    local_120[0]._0_8_ = &local_200;
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              (&local_2c0,&local_180,0,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              (&local_2c0.super_Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>,
               local_120);
    local_120[0]._0_8_ = &local_220;
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              (&local_2c0,&local_180,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              (&local_2c0.super_Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>,
               local_120);
    local_120[0]._0_8_ = &local_2f0;
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              (&local_2c0,&local_180,6,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              (&local_2c0.super_Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>,
               local_120);
    local_120[0]._0_8_ = local_318 + 1;
    Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
              (&local_2c0,&local_180,9,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
              (&local_2c0.super_Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>,
               local_120);
    for (row = 0; row != 0xc; row = row + 1) {
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1> *)&local_c0,
                          row,0);
      *pSVar1 = *pSVar1 + 1e-09;
      Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
                (&local_2c0,&local_c0,0,3);
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
                (&local_198,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 &local_2c0,(type *)0x0);
      Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
                (&local_2c0,&local_c0,3,3);
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
                (&local_1b0,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 &local_2c0,(type *)0x0);
      Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
                (&local_2c0,&local_c0,6,3);
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
                (&local_1c8,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 &local_2c0,(type *)0x0);
      Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
                (&local_2c0,&local_c0,9,3);
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
                (&local_1e0,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 &local_2c0,(type *)0x0);
      (*this->_vptr_ChDampingReissner[2])
                (z_inf,z_sup,angle,this,&local_200,&local_220,&local_2f0,local_318 + 1,&local_198,
                 &local_1b0,&local_1c8,&local_1e0);
      local_258[0] = (double *)&local_200;
      Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_120,
                 (Matrix<double,_12,_1,_0,_12,_1> *)&local_2c0,0,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
                ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)local_120,
                 (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_258);
      local_258[0] = (double *)&local_220;
      Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_120,
                 (Matrix<double,_12,_1,_0,_12,_1> *)&local_2c0,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
                ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)local_120,
                 (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_258);
      local_258[0] = (double *)&local_2f0;
      Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_120,
                 (Matrix<double,_12,_1,_0,_12,_1> *)&local_2c0,6,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
                ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)local_120,
                 (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_258);
      local_258[0] = local_318 + 1;
      Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_120,
                 (Matrix<double,_12,_1,_0,_12,_1> *)&local_2c0,9,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
                ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)local_120,
                 (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_258);
      local_2d0 = &local_180;
      local_318[0] = 999999999.9999999;
      local_2d8 = (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *
                  )&local_2c0;
      Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
                        *)local_258,local_318,(StorageBaseType *)&local_2d8);
      Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,12,1,0,12,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,12,1,0,12,1>const,Eigen::Matrix<double,12,1,0,12,1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_120,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>_>
                  *)local_258);
      Eigen::
      Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>
      ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
               *)local_258,R,0,row,0xc,1);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>,Eigen::Matrix<double,12,1,0,12,1>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
                  *)local_258,(Matrix<double,_12,_1,_0,_12,_1> *)local_120);
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_1> *)&local_c0,
                          row,0);
      *pSVar1 = *pSVar1 + -1e-09;
    }
    return;
  }
  __assert_fail("R.cols() == 12",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMaterialShellReissner.cpp"
                ,0x249,
                "virtual void chrono::fea::ChDampingReissner::ComputeDampingMatrix(ChMatrixRef, const ChVector<> &, const ChVector<> &, const ChVector<> &, const ChVector<> &, const double, const double, const double)"
               );
}

Assistant:

void ChDampingReissner::ComputeDampingMatrix(
    ChMatrixRef R,             // 12x12 material damping matrix values here
    const ChVector<>& deps_u,  // time derivative of strains along \e u direction
    const ChVector<>& deps_v,  // time derivative of strains along \e v direction
    const ChVector<>& dkur_u,  // time derivative of curvature along \e u direction
    const ChVector<>& dkur_v,  // time derivative of curvature along \e v direction
    const double z_inf,        // layer lower z value (along thickness coord)
    const double z_sup,        // layer upper z value (along thickness coord)
    const double angle         // layer angle respect to x (if needed) -not used in this, isotropic+
) {
    assert(R.rows() == 12);
    assert(R.cols() == 12);

    R.setZero();

    ChVectorN<double, 12> dstrain_0;
    dstrain_0.segment(0, 3) = deps_u.eigen();
    dstrain_0.segment(3, 3) = deps_v.eigen();
    dstrain_0.segment(6, 3) = dkur_u.eigen();
    dstrain_0.segment(9, 3) = dkur_v.eigen();

    ChVector<> nu, nv, mu, mv;
    this->ComputeStress(nu, nv, mu, mv, deps_u, deps_v, dkur_u, dkur_v, z_inf, z_sup, angle);

    ChVectorN<double, 12> stress_0;
    stress_0.segment(0,3) = nu.eigen();
    stress_0.segment(3,3) = nv.eigen();
    stress_0.segment(6,3) = mu.eigen();
    stress_0.segment(9,3) = mv.eigen();

    double delta = 1e-9;
    for (int i = 0; i < 12; ++i) {
        dstrain_0(i, 0) += delta;
        ChVector<> ddeps_u(dstrain_0.segment(0, 3));
        ChVector<> ddeps_v(dstrain_0.segment(3, 3));
        ChVector<> ddkur_u(dstrain_0.segment(6, 3));
        ChVector<> ddkur_v(dstrain_0.segment(9, 3));
        this->ComputeStress(nu, nv, mu, mv, ddeps_u, ddeps_v, ddkur_u, ddkur_v, z_inf, z_sup, angle);
        ChVectorN<double, 12> stress_1;
        stress_1.segment(0,3) = nu.eigen();
        stress_1.segment(3,3) = nv.eigen();
        stress_1.segment(6,3) = mu.eigen();
        stress_1.segment(9,3) = mv.eigen();
        ChVectorN<double, 12> stress_d = (1. / delta) * (stress_1 - stress_0);
        R.block(0, i, 12, 1) = stress_d;
        dstrain_0(i, 0) -= delta;
    }
}